

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestUtil::TextureCubeArrayShader::shadeFragments
          (TextureCubeArrayShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  DataType DVar1;
  TextureCubeArray *this_00;
  GenericVec4 *pGVar2;
  int iVar3;
  float *pfVar4;
  FragmentPacket *packet;
  Vec4 *output;
  long lVar5;
  int fragNdx;
  uint uVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  Vec4 coord;
  UVec4 uicolor;
  IVec4 icolor;
  Vec4 texBias;
  Vec4 texScale;
  Vec4 texCoords [4];
  Vec4 colors [4];
  uint local_128;
  deUint32 local_120;
  deUint32 dStack_11c;
  float local_118;
  deUint32 local_114;
  ulong local_110;
  FragmentPacket *local_108;
  ulong local_100;
  deUint32 local_f8;
  deUint32 dStack_f4;
  deUint32 dStack_f0;
  deUint32 dStack_ec;
  deUint32 local_e8;
  deUint32 dStack_e4;
  deUint32 dStack_e0;
  deUint32 dStack_dc;
  Vector<float,_4> local_d8;
  Vector<float,_4> local_c8;
  Vec4 local_b8 [4];
  Vec4 local_78 [4];
  
  local_108 = packets;
  tcu::Vector<float,_4>::Vector
            (&local_c8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[2].value);
  tcu::Vector<float,_4>::Vector
            (&local_d8,
             (float (*) [4])
             &(this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[3].value);
  lVar5 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_b8[0].m_data + lVar5));
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  lVar5 = 0;
  do {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_78[0].m_data + lVar5));
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  local_110 = 0;
  local_100 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    local_100 = local_110;
  }
  do {
    if (local_110 == local_100) {
      return;
    }
    this_00 = (this->super_ShaderProgram).m_uniforms.
              super__Vector_base<sglr::UniformSlot,_std::allocator<sglr::UniformSlot>_>._M_impl.
              super__Vector_impl_data._M_start[1].sampler.texCubeArray;
    packet = local_108 + local_110;
    pfVar4 = local_b8[0].m_data + 3;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      rr::readTriangleVarying<float>((rr *)&local_120,packet,context,0,(int)lVar5);
      iVar3 = this->m_layer;
      *(ulong *)((Vec4 *)(pfVar4 + -3))->m_data = CONCAT44(dStack_11c,local_120);
      pfVar4[-1] = local_118;
      *pfVar4 = (float)iVar3;
      pfVar4 = pfVar4 + 4;
    }
    output = local_78;
    sglr::rc::TextureCubeArray::sample4(this_00,output,local_b8,0.0);
    local_128 = (int)local_110 * 4;
    for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
      tcu::operator*((tcu *)&local_e8,output,&local_c8);
      tcu::operator+((tcu *)&local_120,(Vector<float,_4> *)&local_e8,&local_d8);
      castVectorSaturate<int>((Vec4 *)&local_120);
      castVectorSaturate<unsigned_int>((Vec4 *)&local_120);
      DVar1 = this->m_outputType;
      uVar6 = (uint)lVar5;
      if (DVar1 == TYPE_UINT_VEC4) {
        pGVar2 = context->outputArray;
        iVar3 = (uVar6 | local_128) * context->numFragmentOutputs;
        dVar7 = local_f8;
        dVar8 = dStack_f4;
        dVar9 = dStack_f0;
        dVar10 = dStack_ec;
LAB_0049ca24:
        pGVar2 = pGVar2 + iVar3;
        (pGVar2->v).uData[0] = dVar7;
        (pGVar2->v).uData[1] = dVar8;
        (pGVar2->v).uData[2] = dVar9;
        (pGVar2->v).uData[3] = dVar10;
      }
      else {
        if (DVar1 == TYPE_INT_VEC4) {
          pGVar2 = context->outputArray;
          iVar3 = (uVar6 | local_128) * context->numFragmentOutputs;
          dVar7 = local_e8;
          dVar8 = dStack_e4;
          dVar9 = dStack_e0;
          dVar10 = dStack_dc;
          goto LAB_0049ca24;
        }
        if (DVar1 == TYPE_FLOAT_VEC4) {
          pGVar2 = context->outputArray;
          iVar3 = (uVar6 | local_128) * context->numFragmentOutputs;
          pGVar2[iVar3].v.uData[0] = local_120;
          pGVar2[iVar3].v.uData[1] = dStack_11c;
          pGVar2[iVar3].v.uData[2] = (deUint32)local_118;
          pGVar2[iVar3].v.uData[3] = local_114;
        }
      }
      output = output + 1;
    }
    local_110 = local_110 + 1;
  } while( true );
}

Assistant:

void TextureCubeArrayShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 texScale (m_uniforms[2].value.f4);
	const tcu::Vec4 texBias	 (m_uniforms[3].value.f4);

	tcu::Vec4 texCoords[4];
	tcu::Vec4 colors[4];

	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		const sglr::rc::TextureCubeArray* tex = m_uniforms[1].sampler.texCubeArray;

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4	coord = rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
			texCoords[fragNdx] = tcu::Vec4(coord.x(), coord.y(), coord.z(), (float)m_layer);
		}

		tex->sample4(colors, texCoords);

		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
		{
			const tcu::Vec4		color	= colors[fragNdx] * texScale + texBias;
			const tcu::IVec4	icolor	= castVectorSaturate<deInt32>(color);
			const tcu::UVec4	uicolor	= castVectorSaturate<deUint32>(color);

			if (m_outputType == glu::TYPE_FLOAT_VEC4)		rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
			else if (m_outputType == glu::TYPE_INT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, icolor);
			else if (m_outputType == glu::TYPE_UINT_VEC4)	rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, uicolor);
			else
				DE_ASSERT(DE_FALSE);
		}
	}
}